

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt_num.c
# Opt level: O0

char * lj_strfmt_wuint9(char *p,uint32_t u)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint32_t d_5;
  uint32_t d_4;
  uint32_t d_3;
  uint32_t d_2;
  uint32_t d_1;
  uint32_t d;
  uint32_t w;
  uint32_t v;
  uint32_t u_local;
  char *p_local;
  
  uVar2 = (u / 10000) % 10000;
  *p = (char)((u / 10000) / 10000) + '0';
  uVar3 = uVar2 % 1000;
  p[1] = (char)(uVar2 / 1000) + '0';
  uVar2 = uVar3 * 0x29 >> 0xc;
  iVar4 = uVar3 + uVar2 * -100;
  p[2] = (char)uVar2 + '0';
  cVar1 = (char)((uint)(iVar4 * 0x67) >> 10);
  p[3] = cVar1 + '0';
  p[4] = (char)iVar4 + cVar1 * -10 + '0';
  uVar2 = (u % 10000) % 1000;
  p[5] = (char)((u % 10000) / 1000) + '0';
  uVar3 = uVar2 * 0x29 >> 0xc;
  iVar4 = uVar2 + uVar3 * -100;
  p[6] = (char)uVar3 + '0';
  cVar1 = (char)((uint)(iVar4 * 0x67) >> 10);
  p[7] = cVar1 + '0';
  p[8] = (char)iVar4 + cVar1 * -10 + '0';
  return p + 9;
}

Assistant:

static char *lj_strfmt_wuint9(char *p, uint32_t u)
{
  uint32_t v = u / 10000, w;
  u -= v * 10000;
  w = v / 10000;
  v -= w * 10000;
  *p++ = (char)('0'+w);
  WINT_R(v, 23, 1000)
  WINT_R(v, 12, 100)
  WINT_R(v, 10, 10)
  *p++ = (char)('0'+v);
  WINT_R(u, 23, 1000)
  WINT_R(u, 12, 100)
  WINT_R(u, 10, 10)
  *p++ = (char)('0'+u);
  return p;
}